

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseBlock(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  Node *pNVar3;
  GetTokenMode GVar4;
  bool bVar5;
  bool bVar6;
  Bool BVar7;
  TidyTagId TVar8;
  int iVar9;
  uint uVar10;
  Node *pNVar11;
  tmbstr ptVar12;
  Dict *pDVar13;
  GetTokenMode mode_00;
  uint local_68;
  undefined4 local_64;
  TidyParserMemory memory;
  
  pLVar1 = doc->lexer;
  if (element == (Node *)0x0) {
    prvTidypopMemory(doc);
    local_68 = 0;
    element = memory.original_node;
  }
  else {
    pDVar13 = element->tag;
    if ((pDVar13->model & 1) != 0) {
      return (Node *)0x0;
    }
    TVar8 = pDVar13->id;
    if (TVar8 == TidyTag_DIV) {
      if (element->parent != (Node *)0x0) {
        pDVar2 = element->parent->tag;
        if ((pDVar2 != (Dict *)0x0) && (pDVar2->id == TidyTag_DL)) {
          BVar7 = prvTidyIsHTML5Mode(doc);
          if (BVar7 != no) {
            pNVar11 = prvTidyParseDefList(doc,element,mode_00);
            return pNVar11;
          }
          pDVar13 = element->tag;
        }
        TVar8 = pDVar13->id;
        goto LAB_00138bdd;
      }
    }
    else {
LAB_00138bdd:
      if ((TVar8 == TidyTag_FORM) && (BVar7 = DescendantOf(element,TidyTag_FORM), BVar7 != no)) {
        prvTidyReport(doc,element,(Node *)0x0,0x243);
        pDVar13 = element->tag;
      }
    }
    uVar10 = pDVar13->model;
    local_68 = 0;
    if ((uVar10 >> 0xb & 1) != 0) {
      local_68 = pLVar1->istackbase;
      pLVar1->istackbase = pLVar1->istacksize;
    }
    if ((uVar10 >> 0x11 & 1) == 0) {
      prvTidyInlineDup(doc,(Node *)0x0);
      uVar10 = element->tag->model;
    }
    memory.reentry_mode = IgnoreWhitespace;
    if ((uVar10 & 0x410) == 0x10) {
      memory.reentry_mode = mode + (mode == IgnoreWhitespace);
    }
  }
  local_64 = 1;
  bVar5 = true;
LAB_00138c67:
  pNVar11 = prvTidyGetToken(doc,memory.reentry_mode);
  if (pNVar11 == (Node *)0x0) {
LAB_0013931b:
    uVar10 = element->tag->model;
    if (-1 < (short)uVar10) {
      prvTidyReport(doc,element,pNVar11,0x25a);
      uVar10 = element->tag->model;
    }
    if ((uVar10 >> 0xb & 1) != 0) {
      while (pLVar1->istackbase < pLVar1->istacksize) {
        prvTidyPopInline(doc,(Node *)0x0);
      }
      pLVar1->istackbase = local_68;
    }
    goto LAB_00139373;
  }
  pDVar13 = pNVar11->tag;
  if (pNVar11->type == EndTag) {
    if (pDVar13 != (Dict *)0x0) {
      if ((pDVar13 == element->tag) || (element->was == pDVar13)) {
        prvTidyFreeNode(doc,pNVar11);
        if ((element->tag->model & 0x800) != 0) {
          while (pLVar1->istackbase < pLVar1->istacksize) {
            prvTidyPopInline(doc,(Node *)0x0);
          }
          pLVar1->istackbase = local_68;
        }
        element->closed = yes;
        goto LAB_00139373;
      }
      goto LAB_00138cae;
    }
    goto LAB_00138cd2;
  }
  if (pDVar13 == (Dict *)0x0) goto LAB_00138d61;
LAB_00138cae:
  TVar8 = pDVar13->id;
  if (((ulong)TVar8 < 0x31) && ((0x1400000010000U >> ((ulong)TVar8 & 0x3f) & 1) != 0)) {
    BVar7 = prvTidynodeIsElement(pNVar11);
    if (BVar7 != no) goto LAB_00138cd2;
LAB_00138ce7:
    prvTidyFreeNode(doc,pNVar11);
    goto LAB_00138c67;
  }
  if (pNVar11->type == EndTag) {
    if (TVar8 == TidyTag_P) {
      pNVar11->type = StartEndTag;
      pNVar11->implicit = yes;
      goto LAB_00138d61;
    }
    if (TVar8 == TidyTag_BR) {
      pNVar11->type = StartTag;
      goto LAB_00138d61;
    }
    BVar7 = DescendantOf(element,TVar8);
    if (BVar7 != no) {
      prvTidyUngetToken(doc);
      goto LAB_0013931b;
    }
    if ((pLVar1->exiled == no) ||
       ((BVar7 = prvTidynodeHasCM(pNVar11,0x80), BVar7 == no &&
        ((pNVar11->tag == (Dict *)0x0 || (pNVar11->tag->id != TidyTag_TABLE)))))) goto LAB_00138d61;
LAB_00139393:
    prvTidyUngetToken(doc);
    goto LAB_00139373;
  }
LAB_00138d61:
  BVar7 = prvTidynodeIsText(pNVar11);
  if (BVar7 != no) {
    if ((bVar5) && ((element->tag->model & 0x20000) == 0)) {
      iVar9 = prvTidyInlineDup(doc,pNVar11);
      bVar5 = false;
      if (0 < iVar9) goto LAB_00138c67;
    }
    prvTidyInsertNodeAtEnd(element,pNVar11);
    bVar6 = false;
    GVar4 = MixedContent;
    memory.reentry_mode = MixedContent;
    bVar5 = false;
    if ((((element != (Node *)0x0) && (memory.reentry_mode = GVar4, element->tag != (Dict *)0x0)) &&
        (uVar10 = element->tag->id - TidyTag_BLOCKQUOTE, bVar5 = bVar6, uVar10 < 0x3d)) &&
       ((0x1002000000400003U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
      prvTidyConstrainVersion(doc,0xfffffedb);
      memory.reentry_mode = MixedContent;
    }
    goto LAB_00138c67;
  }
  BVar7 = InsertMisc(element,pNVar11);
  if (BVar7 != no) goto LAB_00138c67;
  if (pNVar11->tag == (Dict *)0x0) {
LAB_00138cd2:
    prvTidyReport(doc,element,pNVar11,0x235);
    goto LAB_00138ce7;
  }
  TVar8 = pNVar11->tag->id;
  if (TVar8 == TidyTag_AREA) {
    if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
       (element->tag->id == TidyTag_MAP)) {
LAB_00138e54:
      BVar7 = prvTidynodeIsElement(pNVar11);
      if (BVar7 == no) goto LAB_00138cd2;
      prvTidyInsertNodeAtEnd(element,pNVar11);
      goto LAB_00138c67;
    }
    goto LAB_00138cd2;
  }
  if (TVar8 == TidyTag_PARAM) {
    BVar7 = prvTidynodeHasCM(element,0x1000);
    if (BVar7 != no) goto LAB_00138e54;
    goto LAB_00138cd2;
  }
  BVar7 = prvTidynodeHasCM(pNVar11,0x10);
  if (BVar7 != no) goto LAB_00138e83;
  BVar7 = prvTidynodeIsElement(pNVar11);
  if (BVar7 == no) {
    if ((pNVar11->tag != (Dict *)0x0) && (pNVar11->tag->id == TidyTag_FORM)) {
      *(byte *)&doc->badForm = (byte)doc->badForm | 1;
    }
    goto LAB_00138cd2;
  }
  if ((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) {
LAB_00138f5b:
    BVar7 = prvTidynodeHasCM(pNVar11,8);
    if (BVar7 == no) {
      if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
         (element->tag->id != TidyTag_TEMPLATE)) {
        if ((pNVar11->tag->model & 4) != 0) goto LAB_00139160;
        if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
           (((element->tag->id == TidyTag_FORM &&
             (((pNVar3 = element->parent, pNVar3 != (Node *)0x0 && (pNVar3->tag != (Dict *)0x0)) &&
              (pNVar3->tag->id == TidyTag_TD)))) && (pNVar3->implicit != no)))) {
          TVar8 = pNVar11->tag->id;
          if (TVar8 == TidyTag_TH) {
            prvTidyReport(doc,element,pNVar11,0x235);
            prvTidyFreeNode(doc,pNVar11);
            pNVar11 = element->parent;
            (*doc->allocator->vtbl->free)(doc->allocator,pNVar11->element);
            ptVar12 = prvTidytmbstrdup(doc->allocator,"th");
            pNVar11->element = ptVar12;
            pDVar13 = prvTidyLookupTagDef(TidyTag_TH);
            pNVar11->tag = pDVar13;
            goto LAB_00138c67;
          }
          if (TVar8 == TidyTag_TD) goto LAB_00138cd2;
        }
        BVar7 = prvTidynodeHasCM(element,0x8000);
        if ((BVar7 == no) && (element->implicit == no)) {
          prvTidyReport(doc,element,pNVar11,0x259);
        }
        if ((*(int *)((doc->config).value + 0x3b) == 0) &&
           (BVar7 = prvTidynodeHasCM(element,0x8000), BVar7 != no)) {
          prvTidyReport(doc,element,pNVar11,0x25b);
        }
        prvTidyUngetToken(doc);
        BVar7 = prvTidynodeHasCM(pNVar11,0x20);
        if (BVar7 == no) {
          BVar7 = prvTidynodeHasCM(pNVar11,0x40);
          if (BVar7 == no) {
            BVar7 = prvTidynodeHasCM(pNVar11,0x80);
            if ((BVar7 == no) && (BVar7 = prvTidynodeHasCM(pNVar11,0x200), BVar7 == no)) {
              BVar7 = prvTidynodeHasCM(element,0x800);
              if (BVar7 == no) goto LAB_00139373;
              while (pLVar1->istackbase < pLVar1->istacksize) {
                prvTidyPopInline(doc,(Node *)0x0);
              }
LAB_001394e6:
              pLVar1->istackbase = local_68;
LAB_00139373:
              TrimSpaces(doc,element);
              return (Node *)0x0;
            }
            if (pLVar1->exiled != no) {
              return (Node *)0x0;
            }
            TVar8 = TidyTag_TABLE;
          }
          else {
            if (((element->parent != (Node *)0x0) &&
                (pDVar13 = element->parent->tag, pDVar13 != (Dict *)0x0)) &&
               (pDVar13->id == TidyTag_DL)) goto LAB_00139373;
            TVar8 = TidyTag_DL;
          }
          pNVar11 = prvTidyInferredTag(doc,TVar8);
          goto LAB_00139257;
        }
        if (((element->parent != (Node *)0x0) &&
            (pDVar13 = element->parent->tag, pDVar13 != (Dict *)0x0)) &&
           (pDVar13->parser == prvTidyParseList)) goto LAB_00139373;
        pNVar11 = prvTidyInferredTag(doc,TidyTag_UL);
        AddClassNoIndent(doc,pNVar11);
        goto LAB_00139257;
      }
    }
    else if (pLVar1->excludeBlocks != no) {
      BVar7 = prvTidynodeHasCM(element,0x8000);
      if (BVar7 == no) {
        prvTidyReport(doc,element,pNVar11,0x259);
      }
      prvTidyUngetToken(doc);
      BVar7 = prvTidynodeHasCM(element,0x800);
      if (BVar7 == no) goto LAB_00139373;
      goto LAB_001394e6;
    }
LAB_00138e83:
    if ((((pNVar11->tag != (Dict *)0x0) && (pNVar11->tag->id == TidyTag_A)) &&
        (pNVar11->implicit == no)) &&
       ((((element != (Node *)0x0 && (element->tag != (Dict *)0x0)) &&
         (element->tag->id == TidyTag_A)) || (BVar7 = DescendantOf(element,TidyTag_A), BVar7 != no))
       )) {
      if (((pNVar11->type == EndTag) || (pNVar11->attributes != (AttVal *)0x0)) ||
         (*(int *)((doc->config).value + 9) == 0)) {
        if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
           (element->tag->id != TidyTag_A)) {
          prvTidyReport(doc,element,pNVar11,0x235);
          prvTidyFreeNode(doc,pNVar11);
        }
        else {
          prvTidyReport(doc,element,pNVar11,0x259);
          prvTidyUngetToken(doc);
        }
        if ((memory.reentry_mode & Preformatted) != IgnoreWhitespace) {
          return (Node *)0x0;
        }
        goto LAB_00139373;
      }
      pNVar11->type = EndTag;
      prvTidyReport(doc,element,pNVar11,0x232);
      prvTidyUngetToken(doc);
      goto LAB_00138c67;
    }
    bVar6 = false;
  }
  else {
    TVar8 = element->tag->id;
    if ((TVar8 != TidyTag_TH) && (TVar8 != TidyTag_TD)) {
      if ((((TVar8 == TidyTag_LI) && (pNVar11->tag != (Dict *)0x0)) &&
          (uVar10 = pNVar11->tag->id - TidyTag_FRAME, uVar10 < 0x2a)) &&
         ((0x30000000003U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) goto LAB_00138cd2;
      goto LAB_00138f5b;
    }
    BVar7 = prvTidynodeHasCM(pNVar11,4);
    if (BVar7 != no) {
LAB_00139160:
      MoveToHead(doc,element,pNVar11);
      goto LAB_00138c67;
    }
    BVar7 = prvTidynodeHasCM(pNVar11,0x20);
    if (BVar7 == no) {
      BVar7 = prvTidynodeHasCM(pNVar11,0x40);
      if (BVar7 != no) {
        prvTidyUngetToken(doc);
        pNVar11 = prvTidyInferredTag(doc,TidyTag_DL);
        goto LAB_001391fa;
      }
    }
    else {
      prvTidyUngetToken(doc);
      pNVar11 = prvTidyInferredTag(doc,TidyTag_UL);
      AddClassNoIndent(doc,pNVar11);
LAB_001391fa:
      pLVar1->excludeBlocks = yes;
    }
    BVar7 = prvTidynodeHasCM(pNVar11,8);
    if (BVar7 == no) goto LAB_00139393;
LAB_00139257:
    if (pNVar11 != (Node *)0x0) goto LAB_00138e83;
    bVar6 = true;
    pNVar11 = (Node *)0x0;
  }
  BVar7 = prvTidynodeIsElement(pNVar11);
  if (BVar7 == no) {
    if (pNVar11->type == EndTag) {
      prvTidyPopInline(doc,pNVar11);
    }
    goto LAB_00138cd2;
  }
  if ((pNVar11->tag->model & 0x10) == 0) {
    local_64 = 0;
LAB_001393a5:
    if (((!bVar6) && (pNVar11->tag != (Dict *)0x0)) && (pNVar11->tag->id == TidyTag_BR)) {
      TrimSpaces(doc,element);
    }
    prvTidyInsertNodeAtEnd(element,pNVar11);
    if (pNVar11->implicit != no) {
      prvTidyReport(doc,element,pNVar11,0x247);
    }
    prvTidypushMemory(doc,(TidyParserMemory)
                          ZEXT2848(CONCAT424(local_64,CONCAT816(pNVar11,CONCAT88(element,
                                                  prvTidyParseBlock)))));
    return pNVar11;
  }
  if (((!bVar5) || (pNVar11->implicit != no)) || ((element->tag->model & 0x20000) != 0))
  goto LAB_001393a5;
  iVar9 = prvTidyInlineDup(doc,pNVar11);
  bVar5 = false;
  if (iVar9 < 1) goto LAB_001393a5;
  goto LAB_00138c67;
}

Assistant:

Node* TY_(ParseBlock)( TidyDocImpl* doc, Node *element, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool checkstack = yes;
    uint istackbase = 0;
    DEBUG_LOG_COUNTERS;
    
    if ( element == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, because the loop overwrites this immediately. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        element = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.reentry_mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(element);

        if ( element->tag->model & CM_EMPTY )
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }

        if ( nodeIsDIV(element) && nodeIsDL(element->parent) && TY_(IsHTML5Mode)(doc) )
        {
            DEBUG_LOG_EXIT;
            return TY_(ParseDefList)(doc, element, mode); /* @warning: possible recursion! */
        }
        
        if ( nodeIsFORM(element) && DescendantOf(element, TidyTag_FORM) )
        {
            TY_(Report)(doc, element, NULL, ILLEGAL_NESTING );
        }

        /*
         InlineDup() asks the lexer to insert inline emphasis tags
         currently pushed on the istack, but take care to avoid
         propagating inline emphasis inside OBJECT or APPLET.
         For these elements a fresh inline stack context is created
         and disposed of upon reaching the end of the element.
         They thus behave like table cells in this respect.
        */
        if (element->tag->model & CM_OBJECT)
        {
            istackbase = lexer->istackbase;
            lexer->istackbase = lexer->istacksize;
        }

        if (!(element->tag->model & CM_MIXED))
        {
            TY_(InlineDup)( doc, NULL );
        }

        /*\
         *  Issue #212 - If it is likely that it may be necessary
         *  to move a leading space into a text node before this
         *  element, then keep the mode MixedContent to keep any
         *  leading space
        \*/
        if ( !(element->tag->model & CM_INLINE) ||
              (element->tag->model & CM_FIELD ) )
        {
            DEBUG_LOG_GET_OLD_MODE;
            mode = IgnoreWhitespace;
            DEBUG_LOG_CHANGE_MODE;
        }
        else if (mode == IgnoreWhitespace)
        {
            /* Issue #212 - Further fix in case ParseBlock() is called with 'IgnoreWhitespace'
               when such a leading space may need to be inserted before this element to
               preserve the browser view */
            DEBUG_LOG_GET_OLD_MODE;
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
        }
    } /* Re-Entering */
    
    /*
     Main Loop
     */
    
    while ((node = TY_(GetToken)(doc, mode /*MixedContent*/)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        /* end tag for this element */
        if (node->type == EndTag && node->tag &&
            (node->tag == element->tag || element->was == node->tag))
        {
            TY_(FreeNode)( doc, node );

            if (element->tag->model & CM_OBJECT)
            {
                /* pop inline stack */
                while (lexer->istacksize > lexer->istackbase)
                    TY_(PopInline)( doc, NULL );
                lexer->istackbase = istackbase;
            }

            element->closed = yes;
            TrimSpaces( doc, element );
            DEBUG_LOG_EXIT;
            return NULL;
        }

        if ( nodeIsHTML(node) || nodeIsHEAD(node) || nodeIsBODY(node) )
        {
            if ( TY_(nodeIsElement)(node) )
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }


        if (node->type == EndTag)
        {
            if (node->tag == NULL)
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            else if ( nodeIsBR(node) )
            {
                node->type = StartTag;
            }
            else if ( nodeIsP(node) )
            {
                /* Cannot have a block inside a paragraph, so no checking
                   for an ancestor is necessary -- but we _can_ have
                   paragraphs inside a block, so change it to an implicit
                   empty paragraph, to be dealt with according to the user's
                   options
                */
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if (DescendantOf( element, node->tag->id ))
            {
                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                TY_(UngetToken)( doc );
                break;
            }
            else
            {
                /* special case </tr> etc. for stuff moved in front of table */
                if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if ( checkstack )
            {
                checkstack = no;
                if (!(element->tag->model & CM_MIXED))
                {
                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
            }

            TY_(InsertNodeAtEnd)(element, node);
            DEBUG_LOG_GET_OLD_MODE
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
            /*
              HTML4 strict doesn't allow mixed content for
              elements with %block; as their content model
            */
            /*
              But only body, map, blockquote, form and
              noscript have content model %block;
            */
            if ( nodeIsBODY(element)       ||
                 nodeIsMAP(element)        ||
                 nodeIsBLOCKQUOTE(element) ||
                 nodeIsFORM(element)       ||
                 nodeIsNOSCRIPT(element) )
                TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            continue;
        }

        if ( InsertMisc(element, node) )
            continue;

        /* allow PARAM elements? */
        if ( nodeIsPARAM(node) )
        {
            if ( TY_(nodeHasCM)(element, CM_PARAM) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* allow AREA elements? */
        if ( nodeIsAREA(node) )
        {
            if ( nodeIsMAP(element) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* ignore unknown start/end tags */
        if ( node->tag == NULL )
        {
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /*
          Allow CM_INLINE elements here.

          Allow CM_BLOCK elements here unless
          lexer->excludeBlocks is yes.

          LI and DD are special cased.

          Otherwise infer end tag for this element.
        */

        if ( !TY_(nodeHasCM)(node, CM_INLINE) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            
            /* #427671 - Fix by Randy Waki - 10 Aug 00 */
            /*
             If an LI contains an illegal FRAME, FRAMESET, OPTGROUP, or OPTION
             start tag, discard the start tag and let the subsequent content get
             parsed as content of the enclosing LI.  This seems to mimic IE and
             Netscape, and avoids an infinite loop: without this check,
             ParseBlock (which is parsing the LI's content) and ParseList (which
             is parsing the LI's parent's content) repeatedly defer to each
             other to parse the illegal start tag, each time inferring a missing
             </li> or <li> respectively.

             NOTE: This check is a bit fragile.  It specifically checks for the
             four tags that happen to weave their way through the current series
             of tests performed by ParseBlock and ParseList to trigger the
             infinite loop.
            */
            if ( nodeIsLI(element) )
            {
                if ( nodeIsFRAME(node)    ||
                     nodeIsFRAMESET(node) ||
                     nodeIsOPTGROUP(node) ||
                     nodeIsOPTION(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                    TY_(FreeNode)( doc, node );  /* DSR - 27Apr02 avoid memory leak */
                    continue;
                }
            }

            if ( nodeIsTD(element) || nodeIsTH(element) )
            {
                /* if parent is a table cell, avoid inferring the end of the cell */

                if ( TY_(nodeHasCM)(node, CM_HEAD) )
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                    lexer->excludeBlocks = yes;
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DL);
                    lexer->excludeBlocks = yes;
                }

                /* infer end of current table cell */
                if ( !TY_(nodeHasCM)(node, CM_BLOCK) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
            else if ( TY_(nodeHasCM)(node, CM_BLOCK) )
            {
                if ( lexer->excludeBlocks )
                {
                    if ( !TY_(nodeHasCM)(element, CM_OPT) )
                        TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );

                    TY_(UngetToken)( doc );

                    if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                        lexer->istackbase = istackbase;

                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
            else if ( ! nodeIsTEMPLATE( element ) )/* things like list items */
            {
                if (node->tag->model & CM_HEAD)
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                /*
                 special case where a form start tag
                 occurs in a tr and is followed by td or th
                */

                if ( nodeIsFORM(element) &&
                     nodeIsTD(element->parent) &&
                     element->parent->implicit )
                {
                    if ( nodeIsTD(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    if ( nodeIsTH(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        node = element->parent;
                        TidyDocFree(doc, node->element);
                        node->element = TY_(tmbstrdup)(doc->allocator, "th");
                        node->tag = TY_(LookupTagDef)( TidyTag_TH );
                        continue;
                    }
                }

                if ( !TY_(nodeHasCM)(element, CM_OPT) && !element->implicit )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );

                /* #521, warn on missing optional end-tags if not omitting them. */
                if ( cfgBool( doc, TidyOmitOptionalTags ) == no && TY_(nodeHasCM)(element, CM_OPT) )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_OPTIONAL );


                TY_(UngetToken)( doc );

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    if ( element->parent && element->parent->tag &&
                         element->parent->tag->parser == TY_(ParseList) )
                    {
                        TrimSpaces( doc, element );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    if ( nodeIsDL(element->parent) )
                    {
                        TrimSpaces( doc, element );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DL);
                }
                else if ( TY_(nodeHasCM)(node, CM_TABLE) || TY_(nodeHasCM)(node, CM_ROW) )
                {
                    /* http://tidy.sf.net/issue/1316307 */
                    /* In exiled mode, return so table processing can
                       continue. */
                    if (lexer->exiled)
                    {
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                else if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                {
                    /* pop inline stack */
                    while ( lexer->istacksize > lexer->istackbase )
                        TY_(PopInline)( doc, NULL );
                    lexer->istackbase = istackbase;
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;

                }
                else
                {
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        /*\
         *  Issue #307 - an <A> tag to ends any open <A> element
         *  Like #427827 - fixed by Randy Waki and Bjoern Hoehrmann 23 Aug 00
         *  in ParseInline(), fix copied HERE to ParseBlock()
         *  href: http://www.w3.org/TR/html-markup/a.html
         *  The interactive element a must not appear as a descendant of the a element.
        \*/
        if ( nodeIsA(node) && !node->implicit &&
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                TY_(UngetToken)( doc );
                continue;
            }

            if (nodeIsA(element))
            {
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);
                TY_(UngetToken)( doc );
            }
            else
            {
                /* Issue #597 - if we not 'UngetToken' then it is being discarded.
                   Add message, and 'FreeNode' - thanks @ralfjunker */
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
            }

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* parse known element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->tag->model & CM_INLINE)
            {
                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if (!(element->tag->model & CM_MIXED)) /* #431731 - fix by Randy Waki 25 Dec 00 */
                    {
                        if ( TY_(InlineDup)(doc, node) > 0 )
                            continue;
                    }
                }

                DEBUG_LOG_GET_OLD_MODE;
                mode = MixedContent;
                DEBUG_LOG_CHANGE_MODE;
            }
            else
            {
                checkstack = yes;
                DEBUG_LOG_GET_OLD_MODE;
                mode = IgnoreWhitespace;
                DEBUG_LOG_CHANGE_MODE;
            }

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces( doc, element );

            TY_(InsertNodeAtEnd)(element, node);

            if (node->implicit)
                TY_(Report)(doc, element, node, INSERTING_TAG );

            /* Issue #212 - WHY is this hard coded to 'IgnoreWhitespace' while an
               effort has been made above to set a 'MixedContent' mode in some cases?
               WHY IS THE 'mode' VARIABLE NOT USED HERE???? */

            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseBlock);
                memory.reentry_node = node;
                memory.reentry_mode = mode;
                memory.original_node = element;
                TY_(pushMemory)(doc, memory);
                DEBUG_LOG_EXIT_WITH_NODE(node);
            }
            return node;
        }

        /* discard unexpected tags */
        if (node->type == EndTag)
            TY_(PopInline)( doc, node );  /* if inline end tag */

        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(Report)(doc, element, node, MISSING_ENDTAG_FOR);

    if (element->tag->model & CM_OBJECT)
    {
        /* pop inline stack */
        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
        lexer->istackbase = istackbase;
    }

    TrimSpaces( doc, element );

    DEBUG_LOG_EXIT;
    return NULL;
}